

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ConstantPattern * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ConstantPattern,slang::ast::Expression_const&,slang::SourceRange>
          (BumpAllocator *this,Expression *args,SourceRange *args_1)

{
  SourceLocation SVar1;
  SourceLocation SVar2;
  ConstantPattern *pCVar3;
  
  pCVar3 = (ConstantPattern *)allocate(this,0x28,8);
  SVar1 = args_1->startLoc;
  SVar2 = args_1->endLoc;
  (pCVar3->super_Pattern).kind = Constant;
  (pCVar3->super_Pattern).syntax = (SyntaxNode *)0x0;
  (pCVar3->super_Pattern).sourceRange.startLoc = SVar1;
  (pCVar3->super_Pattern).sourceRange.endLoc = SVar2;
  pCVar3->expr = args;
  return pCVar3;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }